

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O3

void __thiscall
duckdb::TypeMismatchException::TypeMismatchException
          (TypeMismatchException *this,PhysicalType type_1,PhysicalType type_2,string *msg)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  undefined7 in_register_00000031;
  ulong uVar7;
  undefined8 uVar8;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  TypeIdToString_abi_cxx11_(&local_50,(duckdb *)CONCAT71(in_register_00000031,type_1),type_2);
  plVar2 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1df8331);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)::std::__cxx11::string::append((char *)&local_b0);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_e0 = *puVar5;
    lStack_d8 = plVar2[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar5;
    local_f0 = (ulong *)*plVar2;
  }
  local_e8 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  TypeIdToString_abi_cxx11_(&local_d0,(duckdb *)(ulong)type_2,(PhysicalType)local_e8);
  uVar7 = 0xf;
  if (local_f0 != &local_e0) {
    uVar7 = local_e0;
  }
  if (uVar7 < local_d0._M_string_length + local_e8) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar8 = local_d0.field_2._M_allocated_capacity;
    }
    if (local_d0._M_string_length + local_e8 <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_f0);
      goto LAB_00e52525;
    }
  }
  puVar3 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_d0._M_dataplus._M_p);
LAB_00e52525:
  local_110 = &local_100;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar3[3];
  }
  else {
    local_100 = *puVar1;
    local_110 = (undefined8 *)*puVar3;
  }
  local_108 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar2 = (long *)::std::__cxx11::string::append((char *)&local_110);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(msg->_M_dataplus)._M_p);
  psVar6 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_70.field_2._M_allocated_capacity = *psVar6;
    local_70.field_2._8_8_ = plVar2[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar6;
    local_70._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_70._M_string_length = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  Exception::Exception(&this->super_Exception,MISMATCH_TYPE,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  *(undefined ***)&this->super_Exception = &PTR__runtime_error_0243dcb8;
  return;
}

Assistant:

TypeMismatchException::TypeMismatchException(const PhysicalType type_1, const PhysicalType type_2, const string &msg)
    : Exception(ExceptionType::MISMATCH_TYPE,
                "Type " + TypeIdToString(type_1) + " does not match with " + TypeIdToString(type_2) + ". " + msg) {
}